

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::to_string<unsigned_long,unsigned_int>
          (string *__return_storage_ptr__,lest *this,unsigned_long *lhs,string *op,uint *rhs)

{
  ostream *poVar1;
  ostringstream os;
  string asStack_1d8 [32];
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string_abi_cxx11_(0x10b73b);
  poVar1 = std::operator<<((ostream *)local_198,local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string_abi_cxx11_(0);
  std::operator<<(poVar1,asStack_1d8);
  std::__cxx11::string::~string(asStack_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}